

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawShadePanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,int lineWidth,
                    QBrush *fill)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QColor *pQVar4;
  ulong uVar5;
  int in_ECX;
  int iVar6;
  int iVar7;
  int iVar8;
  int in_EDX;
  int in_ESI;
  QColor *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QLineF *this;
  int i;
  int y2;
  int x2;
  int y1;
  int x1;
  qreal inverseScale;
  bool isTranslated;
  qreal devicePixelRatio;
  QList<QLineF> lines;
  QColor light;
  QColor shade;
  QPainterStateGuard painterGuard;
  undefined3 in_stack_fffffffffffffeb8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffebc;
  int iVar10;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  QPainterStateGuard *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  byte bVar11;
  undefined7 in_stack_fffffffffffffee8;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  qsizetype in_stack_ffffffffffffff28;
  char local_58 [32];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (byte)y2 & 1;
  if ((in_ECX != 0) && (in_R8D != 0)) {
    uVar9 = CONCAT13(1,in_stack_fffffffffffffeb8);
    if ((-1 < in_ECX) && (uVar9 = CONCAT13(1,in_stack_fffffffffffffeb8), -1 < in_R8D)) {
      uVar9 = CONCAT13(y1 < 0,in_stack_fffffffffffffeb8);
    }
    if ((char)((uint)uVar9 >> 0x18) != '\0') {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffed0,
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec4,(char *)CONCAT44(in_stack_fffffffffffffebc,uVar9));
      QMessageLogger::warning(local_58,"qDrawShadePanel: Invalid parameters");
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPainterStateGuard::QPainterStateGuard
              (in_stack_fffffffffffffed0,
               (QPainter *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (InitialState)((uint)in_stack_fffffffffffffec4 >> 0x18));
    this = (QLineF *)QStyleHelper::getDpr((QPainter *)0x3f8fc5);
    bVar11 = 0;
    bVar2 = qFuzzyCompare((double)CONCAT17(bVar1,in_stack_fffffffffffffee8),(double)this);
    local_108 = in_R8D;
    local_104 = in_ECX;
    local_100 = in_EDX;
    local_fc = in_ESI;
    if (!bVar2) {
      in_stack_fffffffffffffed0 = (QPainterStateGuard *)(1.0 / (double)this);
      QPainter::scale((double)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffed0);
      local_fc = qRound(2.05811641517409e-317);
      local_100 = qRound(2.05812876681523e-317);
      local_104 = (int)((double)this * (double)in_ECX);
      local_108 = (int)((double)this * (double)in_R8D);
      y1 = qRound(2.05816631580432e-317);
      QPainter::translate((QPainter *)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                          (qreal)in_stack_fffffffffffffed0,
                          (qreal)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar11 = 1;
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::dark((QPalette *)0x3f90d8);
    pQVar4 = QBrush::color((QBrush *)0x3f90e0);
    local_28 = *(undefined1 **)pQVar4;
    local_20 = *(undefined1 **)((long)&pQVar4->ct + 4);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::light((QPalette *)0x3f911f);
    pQVar4 = QBrush::color((QBrush *)0x3f9127);
    local_38 = *(undefined1 **)pQVar4;
    local_30 = *(undefined1 **)((long)&pQVar4->ct + 4);
    if (inverseScale != 0.0) {
      pQVar4 = QBrush::color((QBrush *)0x3f915a);
      uVar5 = QColor::operator==(pQVar4,(QColor *)&local_28);
      if ((uVar5 & 1) != 0) {
        QPalette::shadow((QPalette *)0x3f917a);
        pQVar4 = QBrush::color((QBrush *)0x3f9182);
        local_28 = *(undefined1 **)pQVar4;
        local_20 = (undefined1 *)CONCAT26(local_20._6_2_,*(undefined6 *)((long)&pQVar4->ct + 4));
      }
      pQVar4 = QBrush::color((QBrush *)0x3f91b0);
      uVar5 = QColor::operator==(pQVar4,(QColor *)&local_38);
      if ((uVar5 & 1) != 0) {
        QPalette::midlight((QPalette *)0x3f91d0);
        pQVar4 = QBrush::color((QBrush *)0x3f91d8);
        local_38 = *(undefined1 **)pQVar4;
        local_30 = (undefined1 *)CONCAT26(local_30._6_2_,*(undefined6 *)((long)&pQVar4->ct + 4));
      }
    }
    QList<QLineF>::QList((QList<QLineF> *)0x3f9235);
    QList<QLineF>::reserve
              ((QList<QLineF> *)CONCAT17(bVar1,in_stack_fffffffffffffee8),in_stack_ffffffffffffff28)
    ;
    if ((bVar1 & 1) == 0) {
      QPainter::setPen(in_RDI);
    }
    else {
      QPainter::setPen(in_RDI);
    }
    iVar3 = local_fc + local_104 + -2;
    iVar7 = local_100;
    iVar6 = local_100;
    iVar8 = local_fc;
    for (iVar10 = 0; iVar10 < y1; iVar10 = iVar10 + 1) {
      iVar6 = iVar6 + 1;
      iVar3 = iVar3 + -1;
      iVar7 = iVar7 + 1;
      QLineF::QLineF(this,(qreal)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                     (qreal)in_stack_fffffffffffffed0,(qreal)CONCAT44(iVar8,iVar6),
                     (qreal)CONCAT44(iVar3,iVar7));
      QList<QLineF>::operator<<
                ((QList<QLineF> *)CONCAT44(iVar3,iVar7),(rvalue_ref)CONCAT44(iVar10,uVar9));
    }
    iVar3 = local_100 + local_108 + -2;
    iVar6 = iVar8;
    for (iVar10 = 0; iVar10 < y1; iVar10 = iVar10 + 1) {
      iVar6 = iVar6 + 1;
      iVar8 = iVar8 + 1;
      iVar7 = iVar7 + -1;
      QLineF::QLineF(this,(qreal)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                     (qreal)in_stack_fffffffffffffed0,(qreal)CONCAT44(iVar6,iVar3),
                     (qreal)CONCAT44(iVar8,iVar7));
      QList<QLineF>::operator<<
                ((QList<QLineF> *)CONCAT44(iVar8,iVar7),(rvalue_ref)CONCAT44(iVar10,uVar9));
    }
    QPainter::drawLines((QPainter *)in_stack_fffffffffffffed0,(QList<QLineF> *)CONCAT44(iVar6,iVar3)
                       );
    QList<QLineF>::clear((QList<QLineF> *)CONCAT44(iVar8,iVar7));
    if ((bVar1 & 1) == 0) {
      QPainter::setPen(in_RDI);
    }
    else {
      QPainter::setPen(in_RDI);
    }
    iVar6 = local_100 + local_108 + -1;
    iVar8 = local_fc + local_104 + -1;
    iVar7 = iVar6;
    for (iVar3 = 0; iVar3 < y1; iVar3 = iVar3 + 1) {
      local_fc = local_fc + 1;
      iVar7 = iVar7 + -1;
      iVar6 = iVar6 + -1;
      QLineF::QLineF(this,(qreal)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                     (qreal)in_stack_fffffffffffffed0,(qreal)CONCAT44(local_fc,iVar7),
                     (qreal)CONCAT44(iVar8,iVar6));
      QList<QLineF>::operator<<
                ((QList<QLineF> *)CONCAT44(iVar8,iVar6),(rvalue_ref)CONCAT44(iVar3,uVar9));
    }
    iVar6 = ((local_100 + local_108) - y1) + -1;
    iVar7 = iVar8;
    for (iVar3 = 0; iVar3 < y1; iVar3 = iVar3 + 1) {
      iVar7 = iVar7 + -1;
      local_100 = local_100 + 1;
      iVar8 = iVar8 + -1;
      QLineF::QLineF(this,(qreal)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                     (qreal)in_stack_fffffffffffffed0,(qreal)CONCAT44(iVar7,local_100),
                     (qreal)CONCAT44(iVar8,iVar6));
      QList<QLineF>::operator<<
                ((QList<QLineF> *)CONCAT44(iVar8,iVar6),(rvalue_ref)CONCAT44(iVar3,uVar9));
    }
    QPainter::drawLines((QPainter *)in_stack_fffffffffffffed0,
                        (QList<QLineF> *)CONCAT44(iVar7,local_100));
    if (inverseScale != 0.0) {
      if ((bVar11 & 1) != 0) {
        QPainter::translate((QPainter *)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                            (qreal)in_stack_fffffffffffffed0,(qreal)CONCAT44(iVar7,local_100));
      }
      QPainter::fillRect((QPainter *)CONCAT17(bVar11,in_stack_fffffffffffffed8),
                         (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         (int)in_stack_fffffffffffffed0,iVar7,local_100,
                         (QBrush *)CONCAT44(iVar8,iVar6));
    }
    QList<QLineF>::~QList((QList<QLineF> *)0x3f95ef);
    QPainterStateGuard::~QPainterStateGuard((QPainterStateGuard *)CONCAT44(iVar8,iVar6));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawShadePanel(QPainter *p, int x, int y, int w, int h,
                      const QPalette &pal, bool sunken,
                      int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawShadePanel: Invalid parameters");
    }

    QPainterStateGuard painterGuard(p);
    const qreal devicePixelRatio = QStyleHelper::getDpr(p);
    bool isTranslated = false;
    if (!qFuzzyCompare(devicePixelRatio, qreal(1))) {
        const qreal inverseScale = qreal(1) / devicePixelRatio;
        p->scale(inverseScale, inverseScale);
        x = qRound(devicePixelRatio * x);
        y = qRound(devicePixelRatio * y);
        w = devicePixelRatio * w;
        h = devicePixelRatio * h;
        lineWidth = qRound(devicePixelRatio * lineWidth);
        p->translate(0.5, 0.5);
        isTranslated = true;
    }

    QColor shade = pal.dark().color();
    QColor light = pal.light().color();
    if (fill) {
        if (fill->color() == shade)
            shade = pal.shadow().color();
        if (fill->color() == light)
            light = pal.midlight().color();
    }
    QList<QLineF> lines;
    lines.reserve(2*lineWidth);

    if (sunken)
        p->setPen(shade);
    else
        p->setPen(light);
    int x1, y1, x2, y2;
    int i;
    x1 = x;
    y1 = y2 = y;
    x2 = x+w-2;
    for (i=0; i<lineWidth; i++) {                // top shadow
        lines << QLineF(x1, y1++, x2--, y2++);
    }
    x2 = x1;
    y1 = y+h-2;
    for (i=0; i<lineWidth; i++) {                // left shado
        lines << QLineF(x1++, y1, x2++, y2--);
    }
    p->drawLines(lines);
    lines.clear();
    if (sunken)
        p->setPen(light);
    else
        p->setPen(shade);
    x1 = x;
    y1 = y2 = y+h-1;
    x2 = x+w-1;
    for (i=0; i<lineWidth; i++) {                // bottom shadow
        lines << QLineF(x1++, y1--, x2, y2--);
    }
    x1 = x2;
    y1 = y;
    y2 = y+h-lineWidth-1;
    for (i=0; i<lineWidth; i++) {                // right shadow
        lines << QLineF(x1--, y1++, x2--, y2);
    }
    p->drawLines(lines);
    if (fill) {                                // fill with fill color
        if (isTranslated)
            p->translate(-0.5, -0.5);
        p->fillRect(x+lineWidth, y+lineWidth, w-lineWidth*2, h-lineWidth*2, *fill);
    }
}